

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::dht_stats_alert::~dht_stats_alert(dht_stats_alert *this)

{
  dht_stats_alert *this_local;
  
  std::vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>::
  ~vector(&this->routing_table);
  std::vector<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>::~vector
            (&this->active_requests);
  libtorrent::alert::~alert(&this->super_alert);
  return;
}

Assistant:

struct TORRENT_EXPORT dht_stats_alert final : alert
	{
		// internal
		dht_stats_alert(aux::stack_allocator& alloc
			, std::vector<dht_routing_bucket> table
			, std::vector<dht_lookup> requests);

		TORRENT_DEFINE_ALERT(dht_stats_alert, 83)

		static constexpr alert_category_t static_category = alert_category::stats;
		std::string message() const override;

		// a vector of the currently running DHT lookups.
		std::vector<dht_lookup> active_requests;

		// contains information about every bucket in the DHT routing
		// table.
		std::vector<dht_routing_bucket> routing_table;
	}